

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Graph::ts(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  reference pvVar3;
  reference piVar4;
  long lVar5;
  int local_a4;
  iterator iStack_a0;
  int i_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_7d;
  int u;
  value_type local_6c;
  undefined1 local_68 [4];
  int i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  Graph *this_local;
  vector<int,_std::allocator<int>_> *temp;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node
       = (_Map_pointer)this;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_68);
  for (local_6c = 0; local_6c < this->size; local_6c = local_6c + 1) {
    if (this->inDegree[local_6c] == 0) {
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,&local_6c);
    }
  }
  local_7d = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  while (bVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    __range2._4_4_ = *pvVar3;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type *)((long)&__range2 + 4));
    pvVar1 = this->adjacencyVector;
    lVar5 = (long)__range2._4_4_;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + lVar5);
    iStack_a0 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + lVar5);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff60), bVar2) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_a4 = *piVar4;
      this->inDegree[local_a4] = this->inDegree[local_a4] + -1;
      if (this->inDegree[local_a4] == 0) {
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,&local_a4);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  local_7d = 1;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

vector<int> Graph::ts(){
    queue<int> q;
    for (int i = 0; i < this->size; i++) {
        if (!this->inDegree[i]) {
            q.push(i);
        }
    }
    vector<int> temp;
    while (!q.empty()) {
        int u = q.front();
        q.pop();
        temp.push_back(u);
        for (int i : adjacencyVector[u]) {
            this->inDegree[i]--;
            if (!this->inDegree[i])
                q.push(i);
        }
    }
    return temp;
}